

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::GenerateByteSize(Map *this,Printer *p)

{
  allocator<char> local_121;
  char *local_120;
  size_type local_118;
  char local_110 [8];
  undefined8 uStack_108;
  Printer *p_local;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  undefined1 local_d8 [64];
  __index_type local_98;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  bool local_70;
  bool local_28;
  
  p_local = p;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Funcs",&local_121);
  local_d8._0_8_ = local_d8 + 0x10;
  if (local_120 == local_110) {
    local_d8._24_8_ = uStack_108;
  }
  else {
    local_d8._0_8_ = local_120;
  }
  local_d8._8_8_ = local_118;
  local_118 = 0;
  local_110[0] = '\0';
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_120 = local_110;
  local_f8._M_unused._M_object = operator_new(0x18);
  *(Map **)local_f8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_f8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_f8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_e0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_d8 + 0x20),
             (function<bool_()> *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  local_90._M_p = (pointer)&local_80;
  local_88 = 0;
  local_80._M_local_buf[0] = '\0';
  local_70 = false;
  if (local_98 == '\x01') {
    std::__cxx11::string::assign((char *)&local_90);
  }
  local_28 = false;
  google::protobuf::io::Printer::Emit
            (p,local_d8,1,0xfb,
             "\n        total_size +=\n            $kTagBytes$ * $pbi$::FromIntSize(this_._internal_$name$_size());\n        for (const auto& entry : this_._internal_$name$()) {\n          total_size += $Funcs$::ByteSizeLong(entry.first, entry.second);\n        }\n      "
            );
  io::Printer::Sub::~Sub((Sub *)local_d8);
  std::__cxx11::string::~string((string *)&local_120);
  return;
}

Assistant:

void Map::GenerateByteSize(io::Printer* p) const {
  p->Emit(
      {
          {"Funcs", [&] { EmitFuncs(field_, p); }},
      },
      R"cc(
        total_size +=
            $kTagBytes$ * $pbi$::FromIntSize(this_._internal_$name$_size());
        for (const auto& entry : this_._internal_$name$()) {
          total_size += $Funcs$::ByteSizeLong(entry.first, entry.second);
        }
      )cc");
}